

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::~Parser(Parser *this)

{
  _free(this);
  (this->m_options).flags = 0;
  (this->m_stack).m_size = 0;
  (this->m_file).str = (char *)0x0;
  (this->m_file).len = 0;
  (this->m_buf).str = (char *)0x0;
  (this->m_buf).len = 0;
  this->m_root_id = 0;
  this->m_tree = (Tree *)0x0;
  this->m_state = (State *)0x0;
  this->m_key_tag_indentation = 0;
  this->m_key_tag2_indentation = 0;
  (this->m_key_tag).str = (char *)0x0;
  (this->m_key_tag).len = 0;
  (this->m_key_tag2).str = (char *)0x0;
  (this->m_key_tag2).len = 0;
  this->m_val_tag_indentation = 0;
  (this->m_val_tag).str = (char *)0x0;
  (this->m_val_tag).len = 0;
  this->m_key_anchor_was_before = false;
  this->m_key_anchor_indentation = 0;
  (this->m_key_anchor).str = (char *)0x0;
  (this->m_key_anchor).len = 0;
  this->m_val_anchor_indentation = 0;
  (this->m_val_anchor).str = (char *)0x0;
  (this->m_val_anchor).len = 0;
  (this->m_filter_arena).str = (char *)0x0;
  (this->m_filter_arena).len = 0;
  this->m_newline_offsets = (size_t *)0x0;
  this->m_newline_offsets_size = 0;
  this->m_newline_offsets_capacity = 0;
  (this->m_newline_offsets_buf).str = (char *)0x0;
  (this->m_newline_offsets_buf).len = 0;
  detail::stack<c4::yml::Parser::State,_16UL>::_free(&this->m_stack);
  return;
}

Assistant:

Parser::~Parser()
{
    _free();
    _clr();
}